

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

int __thiscall
baryonyx::itm::compute_order::
push_and_run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array,float>
          (compute_order *this,
          solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
          *solver,bit_array *x,random_engine *rng,float kappa,float delta,float theta,
          float objective_amplifier)

{
  constraint_order cVar1;
  bool bVar2;
  constraint_order cVar3;
  int iVar4;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_28;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_20;
  
  cVar3 = this->order;
  if (this->use_cycle == true) {
    cVar1 = cVar3 + reversing;
    bVar2 = (int)cVar3 < 7;
    cVar3 = none;
    if (bVar2) {
      cVar3 = cVar1;
    }
    this->order = cVar3;
  }
  switch(cVar3) {
  case reversing:
    local_20.current._M_current =
         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
         (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_28.current._M_current =
         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
         (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
    solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>
    ::
    push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
              ((solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>
                *)solver,x,&local_20,&local_28,kappa,delta,theta,objective_amplifier);
    iVar4 = compute_violated_constraints<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array>
                      (solver,x,&this->R);
    return iVar4;
  case random_sorting:
    std::
    shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,rng);
    solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>
    ::
    push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>
                *)solver,x,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,kappa,delta,theta,objective_amplifier);
    goto LAB_00332a57;
  case infeasibility_decr:
    std::
    __sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::compute_order::push_and_run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array,float>(baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,float,float,float,float)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              ((this->m_order).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (this->m_order).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    goto LAB_00332976;
  case infeasibility_incr:
    std::
    __sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::compute_order::push_and_run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array,float>(baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,float,float,float,float)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              ((this->m_order).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (this->m_order).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
LAB_00332976:
    solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>
    ::
    push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
              ((solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>
                *)solver,x,
               (this->m_order).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (this->m_order).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,kappa,delta,theta,objective_amplifier);
    iVar4 = infeasibility_local_compute_violated_constraints<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array>
                      (this,solver,x);
    return iVar4;
  case lagrangian_decr:
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::compute_order::push_and_run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array,float>(baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,float,float,float,float)::_lambda(auto:1,auto:2)_1_>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quesnel[P]baryonyx_lib_src_itm_common_hpp:748:35)>
                )solver);
    break;
  case lagrangian_incr:
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::compute_order::push_and_run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array,float>(baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,float,float,float,float)::_lambda(auto:1,auto:2)_2_>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quesnel[P]baryonyx_lib_src_itm_common_hpp:763:35)>
                )solver);
    break;
  case pi_sign_change:
    std::
    shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,rng);
    solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>
    ::
    push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>
                *)solver,x,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,kappa,delta,theta,objective_amplifier);
    iVar4 = local_compute_violated_constraints<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array>
                      (this,solver,x);
    return iVar4;
  }
  solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>
  ::
  push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            ((solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>
              *)solver,x,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             (this->R).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,kappa,delta,theta,objective_amplifier);
LAB_00332a57:
  iVar4 = compute_violated_constraints<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array>
                    (solver,x,&this->R);
  return iVar4;
}

Assistant:

int push_and_run(Solver& solver,
                     Xtype& x,
                     random_engine& rng,
                     Float kappa,
                     Float delta,
                     Float theta,
                     Float objective_amplifier)
    {
        bool pi_changed = 0;
        int remaining = 0;

        if (use_cycle)
            order = next_state(order);

        switch (order) {
        case solver_parameters::constraint_order::reversing:
            solver.push_and_compute_update_row(x,
                                               R.crbegin(),
                                               R.crend(),
                                               kappa,
                                               delta,
                                               theta,
                                               objective_amplifier);

            return compute_violated_constraints(solver, x, R);
        case solver_parameters::constraint_order::random_sorting:
            std::shuffle(R.begin(), R.end(), rng);

            solver.push_and_compute_update_row(
              x, R.begin(), R.end(), kappa, delta, theta, objective_amplifier);

            return compute_violated_constraints(solver, x, R);
        case solver_parameters::constraint_order::infeasibility_decr:
            std::sort(m_order.begin(),
                      m_order.end(),
                      [](const auto& lhs, const auto& rhs) {
                          return rhs.second < lhs.second;
                      });

            solver.push_and_compute_update_row(x,
                                               m_order.cbegin(),
                                               m_order.cend(),
                                               kappa,
                                               delta,
                                               theta,
                                               objective_amplifier);

            return infeasibility_local_compute_violated_constraints(solver, x);
        case solver_parameters::constraint_order::infeasibility_incr:
            std::sort(m_order.begin(),
                      m_order.end(),
                      [](const auto& lhs, const auto& rhs) {
                          return lhs.second < rhs.second;
                      });
            solver.push_and_compute_update_row(x,
                                               m_order.cbegin(),
                                               m_order.cend(),
                                               kappa,
                                               delta,
                                               theta,
                                               objective_amplifier);

            return infeasibility_local_compute_violated_constraints(solver, x);
        case solver_parameters::constraint_order::lagrangian_decr:
            std::sort(
              R.begin(), R.end(), [&solver](const auto lhs, const auto rhs) {
                  return solver.pi[rhs] < solver.pi[lhs];
              });

            solver.push_and_compute_update_row(x,
                                               R.cbegin(),
                                               R.cend(),
                                               kappa,
                                               delta,
                                               theta,
                                               objective_amplifier);

            return compute_violated_constraints(solver, x, R);
        case solver_parameters::constraint_order::lagrangian_incr:
            std::sort(
              R.begin(), R.end(), [&solver](const auto lhs, const auto rhs) {
                  return solver.pi[lhs] < solver.pi[rhs];
              });

            solver.push_and_compute_update_row(x,
                                               R.cbegin(),
                                               R.cend(),
                                               kappa,
                                               delta,
                                               theta,
                                               objective_amplifier);

            return compute_violated_constraints(solver, x, R);
        case solver_parameters::constraint_order::pi_sign_change:
            std::shuffle(R.begin(), R.end(), rng);

            pi_changed = solver.push_and_compute_update_row(
              x, R.begin(), R.end(), kappa, delta, theta, objective_amplifier);
            remaining = local_compute_violated_constraints(solver, x);

            if (!pi_changed && remaining == 0)
                return 0;

            return remaining;
        case solver_parameters::constraint_order::none:
        default:
            solver.push_and_compute_update_row(x,
                                               R.cbegin(),
                                               R.cend(),
                                               kappa,
                                               delta,
                                               theta,
                                               objective_amplifier);
            return compute_violated_constraints(solver, x, R);
        }
    }